

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

ktx_error_code_e ktxPrintInfoForMemory(ktx_uint8_t *bytes,ktx_size_t size)

{
  ktx_error_code_e kVar1;
  ktxStream stream;
  ktx_error_code_e result;
  ktx_size_t in_stack_ffffffffffffff88;
  ktx_uint8_t *in_stack_ffffffffffffff90;
  ktxStream *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffe8;
  
  kVar1 = ktxMemStream_construct_ro
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (kVar1 == KTX_SUCCESS) {
    kVar1 = ktxPrintInfoForStream((ktxStream *)(ulong)in_stack_ffffffffffffffe8);
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxPrintInfoForMemory(const ktx_uint8_t* bytes, ktx_size_t size)
{
    KTX_error_code result;
    ktxStream stream;

    result = ktxMemStream_construct_ro(&stream, bytes, size);
    if (result == KTX_SUCCESS)
        result = ktxPrintInfoForStream(&stream);
    return result;
}